

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O3

short __thiscall C3DFile::getParamGeneric<short>(C3DFile *this,char *id_str,short default_value)

{
  size_t sVar1;
  short sVar2;
  ulong uVar3;
  ParameterInfo param_info;
  ParameterInfo local_b8;
  ParameterInfo local_68;
  
  local_b8.name_length = -1;
  local_b8.group_id = -1;
  local_b8.name = (char *)0x0;
  local_b8.next_offset = -1;
  local_b8.data_type = -1;
  local_b8.n_dimensions = 0xff;
  local_b8.dimensions = (byte *)0x0;
  local_b8.char_data = (char *)0x0;
  local_b8.int_data = (short *)0x0;
  local_b8.float_data = (float *)0x0;
  local_b8.descr_length = -1;
  local_b8.description = (char *)0x0;
  local_b8.locked = false;
  getParamInfo(&local_68,this,id_str);
  ParameterInfo::operator=(&local_b8,&local_68);
  ParameterInfo::~ParameterInfo(&local_68);
  if (local_b8.n_dimensions == '\0') {
    if (local_b8.data_type != '\x02') {
      __assert_fail("check_param_type<T>(param_info.data_type)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                    ,0x1e2,"T C3DFile::getParamGeneric(const char *, T) [T = short]");
    }
    sVar2 = *local_b8.int_data;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid query for parameter ",0x1c);
    if (id_str == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1111d8);
    }
    else {
      sVar1 = strlen(id_str);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,id_str,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,": parameter is multidimensional (dim = ",0x27);
    std::ostream::operator<<((ostream *)&std::cerr,(uint)*local_b8.dimensions);
    if (1 < local_b8.n_dimensions) {
      uVar3 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", ",2);
        std::ostream::operator<<((ostream *)&std::cerr,(uint)local_b8.dimensions[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar3 < local_b8.n_dimensions);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,").",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    sVar2 = 0;
  }
  ParameterInfo::~ParameterInfo(&local_b8);
  return sVar2;
}

Assistant:

T C3DFile::getParamGeneric(const char* id_str, T default_value) {
	ParameterInfo param_info;

	param_info = getParamInfo(id_str);

	/*
	std::cout << "param_info.data_type    = " << static_cast<int>(param_info.data_type) << std::endl;
	std::cout << "param_info.n_dimensions = " << static_cast<int>(param_info.n_dimensions) << std::endl;
	std::cout << "param_info.n_dimensions = " << static_cast<int>(param_info.dimensions[0]) << std::endl;
	*/

	if (param_info.n_dimensions != 0 ||
			(param_info.n_dimensions == 1 && param_info.dimensions[0] != 1)) {
		std::cerr << "Invalid query for parameter " << id_str << ": parameter is multidimensional (dim = ";

		int i;
		std::cerr << static_cast<int>(param_info.dimensions[0]);
		for (i = 1; i < param_info.n_dimensions; i++) {
			std::cerr << ", " << static_cast<int>(param_info.dimensions[i]);
		}
		std::cerr << ")." << std::endl;
		return 0;
	}

	assert (param_info.n_dimensions == 0 ||
			(param_info.n_dimensions == 1 && param_info.dimensions[0] == 1));
	assert (check_param_type<T>(param_info.data_type));

	if (param_info.data_type == 1 || param_info.data_type == -1)
		return param_info.char_data[0];
	if (param_info.data_type == 2)
		return param_info.int_data[0];
	if (param_info.data_type == 4)
		return param_info.float_data[0];

	return default_value;
}